

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O3

ps_mgau_t * ptm_mgau_init(acmod_t *acmod,bin_mdef_t *mdef)

{
  uint uVar1;
  uint uVar2;
  feat_t *pfVar3;
  uint32 *puVar4;
  int iVar5;
  ptm_mgau_t *s;
  logmath_t *plVar6;
  char *pcVar7;
  char *varfile;
  gauden_t *pgVar8;
  uint8 *puVar9;
  ptm_fast_eval_t *ppVar10;
  long lVar11;
  err_lvl_t lvl;
  ulong uVar12;
  ulong uVar13;
  uint32 *puVar14;
  float64 base;
  double dVar15;
  
  s = (ptm_mgau_t *)
      __ckd_calloc__(1,0x78,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                     ,0x325);
  s->config = acmod->config;
  plVar6 = logmath_retain(acmod->lmath);
  s->lmath = plVar6;
  base = logmath_get_base(acmod->lmath);
  plVar6 = logmath_init(base,10,1);
  s->lmath_8b = plVar6;
  if (plVar6 != (logmath_t *)0x0) {
    iVar5 = logmath_get_width(plVar6);
    if (iVar5 == 1) {
      pcVar7 = ps_config_str(s->config,"mean");
      varfile = ps_config_str(s->config,"var");
      dVar15 = ps_config_float(s->config,"varfloor");
      pgVar8 = gauden_init(pcVar7,varfile,(float32)(float)dVar15,s->lmath);
      s->g = pgVar8;
      if (pgVar8 == (gauden_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                ,0x339,"Failed to read means and variances\n");
      }
      else {
        uVar1 = pgVar8->n_mgau;
        uVar12 = (ulong)uVar1;
        if ((int)uVar1 < 0x101) {
          uVar13 = (ulong)(uint)mdef->n_ciphone;
          if (uVar1 == mdef->n_ciphone) {
            uVar1 = pgVar8->n_feat;
            uVar12 = (ulong)uVar1;
            pfVar3 = acmod->fcb;
            uVar2 = pfVar3->n_sv;
            if (uVar2 == 0) {
              uVar2 = pfVar3->n_stream;
            }
            uVar13 = (ulong)uVar2;
            if (uVar1 == uVar2) {
              if (0 < (int)uVar1) {
                puVar14 = &pfVar3->out_dim;
                lVar11 = 0;
                do {
                  uVar1 = *(uint *)((long)pgVar8->featlen + lVar11);
                  if (pfVar3->lda == (mfcc_t ***)0x0) {
                    puVar4 = pfVar3->sv_len;
                    if (puVar4 == (uint32 *)0x0) {
                      if (uVar1 != *(uint *)((long)pfVar3->stream_len + lVar11)) {
                        puVar14 = (uint32 *)(lVar11 + (long)pfVar3->stream_len);
                        goto LAB_0013e832;
                      }
                    }
                    else if (uVar1 != *(uint *)((long)puVar4 + lVar11)) {
                      puVar14 = (uint32 *)((long)puVar4 + lVar11);
LAB_0013e832:
                      uVar13 = (ulong)*puVar14;
                      pcVar7 = "Dimension of stream %d does not match: %d != %d\n";
                      lVar11 = 0x350;
                      lvl = ERR_ERROR;
                      uVar12 = (ulong)uVar1;
                      goto LAB_0013e850;
                    }
                  }
                  else if (uVar1 != *puVar14) goto LAB_0013e832;
                  lVar11 = lVar11 + 4;
                } while (uVar12 << 2 != lVar11);
              }
              pcVar7 = ps_config_str(s->config,"sendump");
              if (pcVar7 == (char *)0x0) {
                pcVar7 = ps_config_str(s->config,"mixw");
                dVar15 = ps_config_float(s->config,"mixwfloor");
                iVar5 = read_mixw(s,pcVar7,dVar15);
              }
              else {
                iVar5 = read_sendump(s,(bin_mdef_t *)(ulong)(uint)acmod->mdef->n_sen,pcVar7);
              }
              if (-1 < iVar5) {
                lVar11 = ps_config_int(s->config,"ds");
                s->ds_ratio = (int16)lVar11;
                lVar11 = ps_config_int(s->config,"topn");
                s->max_topn = (short)lVar11;
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                        ,0x362,"Maximum top-N: %d\n",(ulong)(uint)(int)(short)lVar11);
                puVar9 = (uint8 *)__ckd_calloc__((long)s->n_sen,1,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                                 ,0x366);
                s->sen2cb = puVar9;
                if (0 < s->n_sen) {
                  lVar11 = 0;
                  do {
                    s->sen2cb[lVar11] = (uint8)acmod->mdef->sen2cimap[lVar11];
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < s->n_sen);
                }
                lVar11 = ps_config_int(s->config,"pl_window");
                iVar5 = (int)lVar11 + 2;
                s->n_fast_hist = iVar5;
                ppVar10 = (ptm_fast_eval_t *)
                          __ckd_calloc__((long)iVar5,0x10,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                         ,0x36e);
                s->hist = ppVar10;
                s->f = ppVar10;
                ptm_mgau_reset_fast_hist((ps_mgau_t *)s);
                (s->base).vt = &ptm_mgau_funcs;
                return &s->base;
              }
              goto LAB_0013e857;
            }
            pcVar7 = "Number of streams does not match: %d != %d\n";
            lVar11 = 0x34a;
            lvl = ERR_ERROR;
          }
          else {
            pcVar7 = 
            "Number of codebooks doesn\'t match number of ciphones, doesn\'t look like PTM: %d != %d\n"
            ;
            lVar11 = 0x344;
            lvl = ERR_INFO;
          }
LAB_0013e850:
          err_msg(lvl,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                  ,lVar11,pcVar7,uVar12,uVar13);
        }
        else {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                  ,0x340,"Number of codebooks exceeds 256: %d\n");
        }
      }
    }
    else {
      logmath_get_base(s->lmath_8b);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
              ,0x330,"Log base %f is too small to represent add table in 8 bits\n");
    }
  }
LAB_0013e857:
  ptm_mgau_free((ps_mgau_t *)s);
  return (ps_mgau_t *)0x0;
}

Assistant:

ps_mgau_t *
ptm_mgau_init(acmod_t *acmod, bin_mdef_t *mdef)
{
    ptm_mgau_t *s;
    ps_mgau_t *ps;
    char const *sendump_path;
    int i;

    s = ckd_calloc(1, sizeof(*s));
    s->config = acmod->config;

    s->lmath = logmath_retain(acmod->lmath);
    /* Log-add table. */
    s->lmath_8b = logmath_init(logmath_get_base(acmod->lmath), SENSCR_SHIFT, TRUE);
    if (s->lmath_8b == NULL)
        goto error_out;
    /* Ensure that it is only 8 bits wide so that fast_logmath_add() works. */
    if (logmath_get_width(s->lmath_8b) != 1) {
        E_ERROR("Log base %f is too small to represent add table in 8 bits\n",
                logmath_get_base(s->lmath_8b));
        goto error_out;
    }

    /* Read means and variances. */
    if ((s->g = gauden_init(ps_config_str(s->config, "mean"),
                            ps_config_str(s->config, "var"),
                            ps_config_float(s->config, "varfloor"),
                            s->lmath)) == NULL) {
        E_ERROR("Failed to read means and variances\n");	
        goto error_out;
    }

    /* We only support 256 codebooks or less (like 640k or 2GB, this
     * should be enough for anyone) */
    if (s->g->n_mgau > 256) {
        E_INFO("Number of codebooks exceeds 256: %d\n", s->g->n_mgau);
        goto error_out;
    }
    if (s->g->n_mgau != bin_mdef_n_ciphone(mdef)) {
        E_INFO("Number of codebooks doesn't match number of ciphones, doesn't look like PTM: %d != %d\n", s->g->n_mgau, bin_mdef_n_ciphone(mdef));
        goto error_out;
    }
    /* Verify n_feat and veclen, against acmod. */
    if (s->g->n_feat != feat_dimension1(acmod->fcb)) {
        E_ERROR("Number of streams does not match: %d != %d\n",
                s->g->n_feat, feat_dimension1(acmod->fcb));
        goto error_out;
    }
    for (i = 0; i < s->g->n_feat; ++i) {
        if ((uint32)s->g->featlen[i] != feat_dimension2(acmod->fcb, i)) {
            E_ERROR("Dimension of stream %d does not match: %d != %d\n",
                    s->g->featlen[i], feat_dimension2(acmod->fcb, i));
            goto error_out;
        }
    }
    /* Read mixture weights. */
    if ((sendump_path = ps_config_str(s->config, "sendump"))) {
        if (read_sendump(s, acmod->mdef, sendump_path) < 0) {
            goto error_out;
        }
    }
    else {
        if (read_mixw(s, ps_config_str(s->config, "mixw"),
                      ps_config_float(s->config, "mixwfloor")) < 0) {
            goto error_out;
        }
    }
    s->ds_ratio = ps_config_int(s->config, "ds");
    s->max_topn = ps_config_int(s->config, "topn");
    E_INFO("Maximum top-N: %d\n", s->max_topn);

    /* Assume mapping of senones to their base phones, though this
     * will become more flexible in the future. */
    s->sen2cb = ckd_calloc(s->n_sen, sizeof(*s->sen2cb));
    for (i = 0; i < s->n_sen; ++i)
        s->sen2cb[i] = bin_mdef_sen2cimap(acmod->mdef, i);

    /* Allocate fast-match history buffers.  We need enough for the
     * phoneme lookahead window, plus the current frame, plus one for
     * good measure? (FIXME: I don't remember why) */
    s->n_fast_hist = ps_config_int(s->config, "pl_window") + 2;
    s->hist = ckd_calloc(s->n_fast_hist, sizeof(*s->hist));
    /* s->f will be a rotating pointer into s->hist. */
    s->f = s->hist;

    ps = (ps_mgau_t *)s;
    ptm_mgau_reset_fast_hist(ps);
    ps->vt = &ptm_mgau_funcs;
    return ps;
error_out:
    ptm_mgau_free(ps_mgau_base(s));
    return NULL;
}